

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Var * kratos::copy_var_const_parm(Var *var,Generator *parent,bool check_param)

{
  bool bVar1;
  uint uVar2;
  VarType VVar3;
  uint32_t uVar4;
  element_type *peVar5;
  element_type *peVar6;
  int64_t iVar7;
  bool *pbVar8;
  UserException *this;
  element_type *peVar9;
  Var *left_00;
  Var *right_00;
  Var *right;
  Var *left;
  shared_ptr<kratos::Expr> expr;
  string local_98;
  undefined1 local_78 [8];
  Const *c_;
  shared_ptr<kratos::Const> c_1;
  Const *c;
  bool correct;
  Param *param_parent;
  shared_ptr<kratos::Param> param;
  bool check_param_local;
  Generator *parent_local;
  Var *var_local;
  
  param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       check_param;
  uVar2 = (*(var->super_IRNode)._vptr_IRNode[0x1b])();
  if ((uVar2 & 1) == 0) {
    VVar3 = Var::type(var);
    if (VVar3 == ConstValue) {
      Var::as<kratos::Const>((Var *)&c_);
      peVar6 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&c_);
      iVar7 = Const::value(peVar6);
      peVar6 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&c_);
      uVar4 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[7])();
      peVar6 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&c_);
      pbVar8 = Var::is_signed(&peVar6->super_Var);
      local_78 = (undefined1  [8])constant(iVar7,uVar4,(bool)(*pbVar8 & 1));
      Var::set_generator((Var *)local_78,parent);
      var_local = (Var *)local_78;
      std::shared_ptr<kratos::Const>::~shared_ptr((shared_ptr<kratos::Const> *)&c_);
    }
    else {
      VVar3 = Var::type(var);
      if (VVar3 != Expression) {
        expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ =
             1;
        this = (UserException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"Only expression with constant and parameters allowed",
                   (allocator<char> *)
                   ((long)&expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        UserException::UserException(this,&local_98);
        expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ =
             0;
        __cxa_throw(this,&UserException::typeinfo,UserException::~UserException);
      }
      Var::as<kratos::Expr>((Var *)&left);
      peVar9 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&left);
      left_00 = copy_var_const_parm(peVar9->left,parent,
                                    (bool)(param.
                                           super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi._7_1_ & 1));
      peVar9 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&left);
      if (peVar9->right == (Var *)0x0) {
        peVar9 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&left);
        var_local = &Generator::expr(parent,peVar9->op,left_00,(Var *)0x0)->super_Var;
      }
      else {
        peVar9 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&left);
        right_00 = copy_var_const_parm(peVar9->right,parent,
                                       (bool)(param.
                                              super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi._7_1_ & 1));
        peVar9 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&left);
        var_local = &Generator::expr(parent,peVar9->op,left_00,right_00)->super_Var;
      }
      std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)&left);
    }
  }
  else {
    Var::as<kratos::Param>((Var *)&param_parent);
    peVar5 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&param_parent);
    var_local = (Var *)Param::parent_param(peVar5);
    bVar1 = check_parent_param((Param *)var_local,parent,
                               (bool)(param.
                                      super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi._7_1_ & 1));
    if (!bVar1) {
      peVar5 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&param_parent);
      iVar7 = Const::value(&peVar5->super_Const);
      peVar5 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&param_parent);
      uVar4 = (*(peVar5->super_Const).super_Var.super_IRNode._vptr_IRNode[7])();
      peVar5 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&param_parent);
      pbVar8 = Var::is_signed((Var *)peVar5);
      c_1.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)constant(iVar7,uVar4,(bool)(*pbVar8 & 1))
      ;
      Var::set_generator((Var *)c_1.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi,parent);
      var_local = (Var *)c_1.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    std::shared_ptr<kratos::Param>::~shared_ptr((shared_ptr<kratos::Param> *)&param_parent);
  }
  return var_local;
}

Assistant:

Var &copy_var_const_parm(Var *var, Generator *parent, bool check_param) {
    if (var->is_param()) {
        auto param = var->as<Param>();
        const auto *param_parent = param->parent_param();
        bool correct = check_parent_param(param_parent, parent, check_param);
        if (correct) {
            return *const_cast<Param *>(param_parent);
        } else {
            // use the current value instead
            auto &c = constant(param->value(), param->width(), param->is_signed());
            c.set_generator(parent);
            return c;
        }

    } else if (var->type() == VarType::ConstValue) {
        auto c = var->as<Const>();
        auto &c_ = constant(c->value(), c->width(), c->is_signed());
        c_.set_generator(parent);
        return c_;
    } else {
        if (var->type() != VarType::Expression)
            throw UserException("Only expression with constant and parameters allowed");
        auto expr = var->as<Expr>();
        auto &left = copy_var_const_parm(expr->left, parent, check_param);
        if (expr->right) {
            auto &right = copy_var_const_parm(expr->right, parent, check_param);
            return parent->expr(expr->op, &left, &right);
        } else {
            return parent->expr(expr->op, &left, nullptr);
        }
    }
}